

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  bool bVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  cmValue cVar4;
  string *psVar5;
  cmValue cVar6;
  string *i;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  cmStandardLevelResolver standardResolver;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  cmGeneratorTarget *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string *local_1f8;
  string msvcRuntimeLibrary;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string compilerSimulateId;
  string compiler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_220 = target;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[7]>
            (&msvcRuntimeLibrary,(char (*) [7])0x6bfdfb,lang,(char (*) [7])0x6c31d2);
  local_1f8 = config;
  AddConfigVariableFlags(this,flags,&msvcRuntimeLibrary,config);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if (compileOrLink == Compile) {
LAB_003d7d84:
    standardResolver.Makefile = this->Makefile;
    cmStandardLevelResolver::GetCompileOptionDef
              (&msvcRuntimeLibrary,&standardResolver,local_220,lang,local_1f8);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar3 = cmTarget::GetMakefile(local_220->Target);
      cVar4 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&compiler,(string *)cVar4.Value);
        init._M_len = 1;
        init._M_array = &compiler;
        cmList::cmList((cmList *)&compilerSimulateId,init);
        std::__cxx11::string::~string((string *)&compiler);
        for (; compilerSimulateId._M_dataplus._M_p != (pointer)compilerSimulateId._M_string_length;
            compilerSimulateId._M_dataplus._M_p = compilerSimulateId._M_dataplus._M_p + 0x20) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])
                    (this,flags,compilerSimulateId._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compilerSimulateId);
      }
    }
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  }
  else if (compileOrLink == Link) {
    pcVar3 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[35]>
              (&msvcRuntimeLibrary,(char (*) [7])0x6bfdfb,lang,
               (char (*) [35])"_LINK_WITH_STANDARD_COMPILE_OPTION");
    bVar1 = cmMakefile::IsOn(pcVar3,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (bVar1) goto LAB_003d7d84;
  }
  pcVar3 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&msvcRuntimeLibrary,(char (*) [7])0x6bfdfb,lang,(char (*) [13])0x68d274);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
  std::__cxx11::string::string((string *)&compiler,(string *)psVar5);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  pcVar3 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            (&msvcRuntimeLibrary,(char (*) [7])0x6bfdfb,lang,(char (*) [13])0x6b4dce);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
  std::__cxx11::string::string((string *)&compilerSimulateId,(string *)psVar5);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  bVar1 = std::operator==(lang,"Swift");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"Swift_LANGUAGE_VERSION",
               (allocator<char> *)&standardResolver);
    cVar4 = cmGeneratorTarget::GetProperty(local_220,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar4.Value != (string *)0x0) {
      pcVar3 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msvcRuntimeLibrary,"CMAKE_Swift_COMPILER_VERSION",
                 (allocator<char> *)&standardResolver);
      psVar5 = (string *)cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      bVar1 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar5,"4.2");
      std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
      if (bVar1) {
        std::operator+(&msvcRuntimeLibrary,"-swift-version ",cVar4.Value);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])
                  (this,flags,&msvcRuntimeLibrary);
LAB_003d7faa:
        std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
      }
    }
  }
  else {
    bVar1 = std::operator==(lang,"CUDA");
    if (bVar1) {
      cmGeneratorTarget::AddCUDAArchitectureFlags(local_220,compileOrLink,local_1f8,flags);
      cmGeneratorTarget::AddCUDAToolkitFlags(local_220,flags);
    }
    else {
      bVar1 = std::operator==(lang,"ISPC");
      if (bVar1) {
        cmGeneratorTarget::AddISPCTargetFlags(local_220,flags);
      }
      else {
        bVar1 = std::operator==(lang,"RC");
        if (bVar1) {
          pcVar3 = this->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msvcRuntimeLibrary,"CMAKE_RC_COMPILER",
                     (allocator<char> *)&standardResolver);
          psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
          lVar7 = std::__cxx11::string::find((char *)psVar5,0x6b4dbf);
          std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
          if (lVar7 != -1) {
            pcVar3 = this->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_C_COMPILER_ID",
                       (allocator<char> *)&standardResolver);
            cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compiler);
            std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
            pcVar3 = this->Makefile;
            if (compiler._M_string_length == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_COMPILER_ID",
                         (allocator<char> *)&standardResolver);
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compiler);
              std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
              pcVar3 = this->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_SIMULATE_ID",
                         (allocator<char> *)&standardResolver);
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_C_SIMULATE_ID",
                         (allocator<char> *)&standardResolver);
              cmMakefile::GetSafeDefinition(pcVar3,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            goto LAB_003d7faa;
          }
        }
        bVar1 = std::operator==(lang,"HIP");
        if (bVar1) {
          cmGeneratorTarget::AddHIPArchitectureFlags(local_220,compileOrLink,local_1f8,flags);
        }
      }
    }
  }
  bVar1 = std::operator==(&compiler,"Clang");
  if (bVar1) {
    pcVar3 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"CMAKE_CLANG_VFS_OVERLAY",
               (allocator<char> *)&standardResolver);
    cVar4 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar4.Value != (string *)0x0) {
      bVar1 = std::operator==(&compilerSimulateId,"MSVC");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msvcRuntimeLibrary,"-Xclang",(allocator<char> *)&local_218);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1d0,"-ivfsoverlay",(allocator<char> *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1b0,"-Xclang",(allocator<char> *)&local_d0);
        std::__cxx11::string::string(local_190,(string *)cVar4.Value);
        __l._M_len = 4;
        __l._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&standardResolver,__l,(allocator_type *)&local_170);
        AppendCompileOptions
                  (this,flags,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&standardResolver,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&standardResolver);
        lVar7 = 0x60;
        do {
          std::__cxx11::string::~string(local_1d0 + lVar7 + -0x20);
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msvcRuntimeLibrary,"-ivfsoverlay",(allocator<char> *)&local_218);
        std::__cxx11::string::string(local_1d0,(string *)cVar4.Value);
        __l_00._M_len = 2;
        __l_00._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&standardResolver,__l_00,(allocator_type *)&local_110);
        AppendCompileOptions
                  (this,flags,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&standardResolver,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&standardResolver);
        lVar7 = 0x20;
        do {
          std::__cxx11::string::~string(local_1d0 + lVar7 + -0x20);
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
      }
    }
  }
  pcVar3 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)&standardResolver);
  cVar4 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY",
               (allocator<char> *)&standardResolver);
    cVar6 = cmGeneratorTarget::GetProperty(local_220,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar6.Value != (string *)0x0) {
      cVar4 = cVar6;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)cVar4.Value);
    standardResolver.Makefile = (cmMakefile *)&local_230;
    local_230._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_50,this,local_1f8,local_220,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&standardResolver);
    std::__cxx11::string::~string((string *)&standardResolver);
    std::__cxx11::string::~string((string *)&local_50);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar3 = this->Makefile;
      std::operator+(&local_110,"CMAKE_",lang);
      std::operator+(&local_218,&local_110,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &standardResolver,&local_218,&msvcRuntimeLibrary);
      cVar4 = cmMakefile::GetDefinition(pcVar3,(string *)&standardResolver);
      std::__cxx11::string::~string((string *)&standardResolver);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_110);
      if (cVar4.Value == (string *)0x0) {
        pcVar3 = this->Makefile;
        std::operator+(&local_218,"CMAKE_",lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &standardResolver,&local_218,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&standardResolver);
        bVar1 = std::operator==(psVar5,"MSVC");
        if (bVar1) {
LAB_003d850b:
          bVar2 = cmSystemTools::GetErrorOccurredFlag();
          bVar2 = !bVar2;
          if (!bVar1) goto LAB_003d8521;
        }
        else {
          pcVar3 = this->Makefile;
          std::operator+(&local_d0,"CMAKE_",lang);
          std::operator+(&local_110,&local_d0,"_SIMULATE_ID");
          psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&local_110);
          bVar2 = std::operator==(psVar5,"MSVC");
          if (bVar2) goto LAB_003d850b;
          bVar2 = false;
LAB_003d8521:
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        std::__cxx11::string::~string((string *)&standardResolver);
        std::__cxx11::string::~string((string *)&local_218);
        if (bVar2) {
          std::operator+(&local_f0,"MSVC_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          std::operator+(&local_170,&local_f0,"\' not known for this ");
          std::operator+(&local_218,&local_170,lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &standardResolver,&local_218," compiler.");
          IssueMessage(this,FATAL_ERROR,(string *)&standardResolver);
          std::__cxx11::string::~string((string *)&standardResolver);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_f0);
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar4.Value,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  }
  pcVar3 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)&standardResolver);
  cVar4 = cmMakefile::GetDefinition(pcVar3,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if ((cVar4.Value != (string *)0x0) && ((cVar4.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"WATCOM_RUNTIME_LIBRARY",
               (allocator<char> *)&standardResolver);
    cVar6 = cmGeneratorTarget::GetProperty(local_220,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar6.Value != (string *)0x0) {
      cVar4 = cVar6;
    }
    std::__cxx11::string::string((string *)&local_70,(string *)cVar4.Value);
    standardResolver.Makefile = (cmMakefile *)&local_230;
    local_230._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_70,this,local_1f8,local_220,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
               (string *)&standardResolver);
    std::__cxx11::string::~string((string *)&standardResolver);
    std::__cxx11::string::~string((string *)&local_70);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar3 = this->Makefile;
      std::operator+(&local_170,"CMAKE_",lang);
      std::operator+(&local_218,&local_170,"_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &standardResolver,&local_218,&msvcRuntimeLibrary);
      cVar4 = cmMakefile::GetDefinition(pcVar3,(string *)&standardResolver);
      std::__cxx11::string::~string((string *)&standardResolver);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_170);
      if (cVar4.Value == (string *)0x0) {
        pcVar3 = this->Makefile;
        std::operator+(&local_218,"CMAKE_",lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &standardResolver,&local_218,"_COMPILER_ID");
        psVar5 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&standardResolver);
        bVar1 = std::operator==(psVar5,"OpenWatcom");
        if (bVar1) {
LAB_003d8832:
          bVar2 = cmSystemTools::GetErrorOccurredFlag();
          bVar2 = !bVar2;
          if (!bVar1) goto LAB_003d8848;
        }
        else {
          pcVar3 = this->Makefile;
          std::operator+(&local_f0,"CMAKE_",lang);
          std::operator+(&local_170,&local_f0,"_SIMULATE_ID");
          psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&local_170);
          bVar2 = std::operator==(psVar5,"OpenWatcom");
          if (bVar2) goto LAB_003d8832;
          bVar2 = false;
LAB_003d8848:
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        std::__cxx11::string::~string((string *)&standardResolver);
        std::__cxx11::string::~string((string *)&local_218);
        if (bVar2) {
          std::operator+(&local_b0,"WATCOM_RUNTIME_LIBRARY value \'",&msvcRuntimeLibrary);
          std::operator+(&local_90,&local_b0,"\' not known for this ");
          std::operator+(&local_218,&local_90,lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &standardResolver,&local_218," compiler.");
          IssueMessage(this,FATAL_ERROR,(string *)&standardResolver);
          std::__cxx11::string::~string((string *)&standardResolver);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar4.Value,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  }
  GetMSVCDebugFormatName
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcRuntimeLibrary,this,local_1f8,local_220);
  if ((local_1d0[0] != (string)0x1) || (msvcRuntimeLibrary._M_string_length == 0))
  goto LAB_003d8aae;
  pcVar3 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[48],std::__cxx11::string&>
            ((string *)&standardResolver,(char (*) [7])0x6bfdfb,lang,
             (char (*) [48])"_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",&msvcRuntimeLibrary);
  cVar4 = cmMakefile::GetDefinition(pcVar3,(string *)&standardResolver);
  std::__cxx11::string::~string((string *)&standardResolver);
  if (cVar4.Value != (string *)0x0) {
    AppendCompileOptions(this,flags,cVar4.Value,(char *)0x0);
    goto LAB_003d8aae;
  }
  pcVar3 = this->Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)&standardResolver,(char (*) [7])0x6bfdfb,lang,(char (*) [13])0x68d274);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&standardResolver);
  __x._M_str = (psVar5->_M_dataplus)._M_p;
  __x._M_len = psVar5->_M_string_length;
  __y._M_str = "MSVC";
  __y._M_len = 4;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
LAB_003d8a3e:
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    bVar2 = !bVar2;
    if (!bVar1) goto LAB_003d8a54;
  }
  else {
    pcVar3 = this->Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
              (&local_218,(char (*) [7])0x6bfdfb,lang,(char (*) [13])0x6b4dce);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&local_218);
    __x_00._M_str = (psVar5->_M_dataplus)._M_p;
    __x_00._M_len = psVar5->_M_string_length;
    __y_00._M_str = "MSVC";
    __y_00._M_len = 4;
    bVar2 = std::operator==(__x_00,__y_00);
    if (bVar2) goto LAB_003d8a3e;
    bVar2 = false;
LAB_003d8a54:
    std::__cxx11::string::~string((string *)&local_218);
  }
  std::__cxx11::string::~string((string *)&standardResolver);
  if (bVar2) {
    cmStrCat<char_const(&)[38],std::__cxx11::string&,char_const(&)[22],std::__cxx11::string_const&,char_const(&)[11]>
              ((string *)&standardResolver,(char (*) [38])"MSVC_DEBUG_INFORMATION_FORMAT value \'",
               &msvcRuntimeLibrary,(char (*) [22])"\' not known for this ",lang,
               (char (*) [11])0x6bfdec);
    IssueMessage(this,FATAL_ERROR,(string *)&standardResolver);
    std::__cxx11::string::~string((string *)&standardResolver);
  }
LAB_003d8aae:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&compilerSimulateId);
  std::__cxx11::string::~string((string *)&compiler);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  // Add the language standard flag for compiling, and sometimes linking.
  if (compileOrLink == cmBuildStep::Compile ||
      (compileOrLink == cmBuildStep::Link &&
       // Some toolchains require use of the language standard flag
       // when linking in order to use the matching standard library.
       // FIXME: If CMake gains an abstraction for standard library
       // selection, this will have to be reconciled with it.
       this->Makefile->IsOn(
         cmStrCat("CMAKE_", lang, "_LINK_WITH_STANDARD_COMPILE_OPTION")))) {
    cmStandardLevelResolver standardResolver(this->Makefile);
    std::string const& optionFlagDef =
      standardResolver.GetCompileOptionDef(target, lang, config);
    if (!optionFlagDef.empty()) {
      cmValue opt =
        target->Target->GetMakefile()->GetDefinition(optionFlagDef);
      if (opt) {
        cmList optList{ *opt };
        for (std::string const& i : optList) {
          this->AppendFlagEscape(flags, i);
        }
      }
    }
  }

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(compileOrLink, config, flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}